

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssm_spur_handler.c
# Opt level: O0

void end_ypspurSSM(void)

{
  return;
}

Assistant:

void end_ypspurSSM()
{
#ifdef HAVE_SSM
  if (g_ssm_enable)
  {
    releaseSSM(&g_odm_bs_sid);
    releaseSSM(&g_odm_sid);
    releaseSSM(&g_motor_sid);
    releaseSSM(&g_ad_sid);
    releaseSSM(&g_odm_adj_sid);
    endSSM();
  }
#endif  // HAVE_SSM
}